

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

uint64_t compute_chunk_unpack_size
                   (int x,int y,int width,int height,int lpc,exr_const_priv_part_t part)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000084;
  long lVar9;
  uint64_t uVar10;
  int iVar11;
  long lVar12;
  
  lVar9 = CONCAT44(in_register_00000084,lpc);
  if ((width == height) && (*(short *)(lVar9 + 0xf2) == 0)) {
    uVar10 = *(uint64_t *)(lVar9 + 0xe8);
  }
  else {
    piVar2 = *(int **)(*(long *)(lVar9 + 0x20) + 0x18);
    lVar9 = (long)*piVar2;
    if (lVar9 < 1) {
      uVar10 = 0;
    }
    else {
      uVar8 = (width + x) - 1;
      uVar4 = 1 - (width + x);
      if (0 < width + x) {
        uVar4 = uVar8;
      }
      lVar3 = *(long *)(piVar2 + 2);
      lVar12 = 0;
      uVar10 = 0;
      do {
        iVar7 = *(int *)(lVar3 + 0x18 + lVar12);
        iVar5 = 1;
        if (iVar7 < 2) {
          iVar5 = y;
        }
        if (1 < iVar7 && y != 1) {
          iVar5 = y / iVar7;
        }
        uVar1 = *(uint *)(lVar3 + 0x1c + lVar12);
        uVar6 = width;
        if (1 < (int)uVar1) {
          iVar7 = x % (int)uVar1;
          if (width == 1) {
            uVar6 = (uint)(iVar7 == 0);
          }
          else {
            iVar11 = uVar1 - iVar7;
            if (iVar7 == 0) {
              iVar11 = 0;
            }
            uVar6 = 0;
            iVar7 = uVar8 - uVar4 % uVar1;
            if (iVar11 + x <= iVar7) {
              uVar6 = (iVar7 - (iVar11 + x)) / (int)uVar1 + 1;
            }
          }
        }
        uVar10 = uVar10 + ((long)iVar5 << (2U - (*(int *)(lVar3 + 0x10 + lVar12) == 1) & 0x3f)) *
                          (long)(int)uVar6;
        lVar12 = lVar12 + 0x20;
      } while (lVar9 * 0x20 != lVar12);
    }
  }
  return uVar10;
}

Assistant:

static uint64_t
compute_chunk_unpack_size (
    int x, int y, int width, int height, int lpc, exr_const_priv_part_t part)
{
    uint64_t unpacksize = 0;
    if (part->chan_has_line_sampling || height != lpc)
    {
        const exr_attr_chlist_t* chanlist = part->channels->chlist;
        for (int c = 0; c < chanlist->num_channels; ++c)
        {
            const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
            uint64_t chansz = ((curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4);

            chansz *=
                (uint64_t) compute_sampled_width (width, curc->x_sampling, x);
            chansz *=
                (uint64_t) compute_sampled_height (height, curc->y_sampling, y);

            unpacksize += chansz;
        }
    }
    else
        unpacksize = part->unpacked_size_per_chunk;
    return unpacksize;
}